

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O1

string * util::fs::join_path(string *__return_storage_ptr__,string *path1,string *path2)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  undefined1 local_40 [8];
  string p2;
  
  sanitize_path((string *)local_40,path2);
  if ((p2._M_dataplus._M_p == (pointer)0x0) || (*(char *)local_40 != '/')) {
    sanitize_path(&local_80,path1);
    plVar2 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_80,local_80._M_string_length,0,'\x01');
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar3;
      local_60 = (long *)*plVar2;
    }
    local_58 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_40 == (undefined1  [8])&p2._M_string_length) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(p2._M_string_length._1_7_,(undefined1)p2._M_string_length);
      *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) = p2.field_2._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(p2._M_string_length._1_7_,(undefined1)p2._M_string_length);
    }
    __return_storage_ptr__->_M_string_length = (size_type)p2._M_dataplus._M_p;
    p2._M_dataplus._M_p = (pointer)0x0;
    p2._M_string_length._0_1_ = 0;
    local_40 = (undefined1  [8])&p2._M_string_length;
  }
  if (local_40 != (undefined1  [8])&p2._M_string_length) {
    operator_delete((void *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
join_path (std::string const& path1, std::string const& path2)
{
    std::string p2 = sanitize_path(path2);
    if (is_absolute(p2))
        return p2;

#ifdef _WIN32
    if (!p2.empty() && p2[0] == '/')
        return sanitize_path(path1) + p2;
#endif

    return sanitize_path(path1) + '/' + p2;
}